

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::DateType::write(DateType *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((DateType *)(&this->field_0x0 + *(long *)((long)*this + -0x28)),in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t DateType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("DateType");

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}